

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<WordSplitStringTest,_testing::internal::TemplateSel<WordSplitStringTest_single_word_Test>,_testing::internal::Types<char32_t>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  pointer pbVar1;
  size_type *psVar2;
  pointer pcVar3;
  CodeLocation CVar4;
  _Alloc_hider _Var5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  SetUpTearDownSuiteFuncType p_Var8;
  SetUpTearDownSuiteFuncType p_Var9;
  undefined8 *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t __n;
  char *pcVar13;
  long lVar14;
  type_info *ptVar15;
  type_info *ptVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 in_stack_fffffffffffffe98;
  type_info *in_stack_fffffffffffffea0;
  type_info *ptVar19;
  long in_stack_fffffffffffffea8;
  TestFactoryBase *pTVar20;
  type_info local_150;
  undefined7 uStack_14f;
  undefined8 uStack_148;
  type_info *local_140;
  long local_138;
  long local_130;
  undefined8 uStack_128;
  size_type *local_120;
  size_type local_118;
  size_type local_110;
  undefined8 uStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  long *local_98 [2];
  long local_88 [2];
  int local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = type_names;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,prefix,(allocator<char> *)&stack0xfffffffffffffe9e);
  pcVar13 = "/";
  if (*prefix == '\0') {
    pcVar13 = "";
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,pcVar13);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_100.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_100.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_100._M_dataplus._M_p = (pointer)paVar12;
  }
  local_100._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_100,case_name);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_e0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_e0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_e0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_e0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_e0,"/");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_c0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_c0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_c0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_c0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (local_a0->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_c0,pbVar1[index]._M_dataplus._M_p,pbVar1[index]._M_string_length);
  local_120 = &local_110;
  psVar2 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar12 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar12) {
    local_110 = paVar12->_M_allocated_capacity;
    uStack_108 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_110 = paVar12->_M_allocated_capacity;
    local_120 = psVar2;
  }
  psVar2 = local_120;
  local_118 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pcVar13 = strchr(test_names,0x2c);
  if (pcVar13 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffea0,test_names,
               (allocator<char> *)&stack0xfffffffffffffe9f);
  }
  else {
    in_stack_fffffffffffffea0 = &local_150;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffea0,test_names,pcVar13);
  }
  local_140 = in_stack_fffffffffffffea0;
  local_138 = in_stack_fffffffffffffea8;
  if (in_stack_fffffffffffffea8 != 0) {
    ptVar15 = in_stack_fffffffffffffea0 + in_stack_fffffffffffffea8;
    do {
      ptVar19 = in_stack_fffffffffffffea0;
      iVar6 = isspace((uint)(byte)ptVar15[-1]);
      local_140 = in_stack_fffffffffffffea0;
      local_138 = in_stack_fffffffffffffea8;
      if (iVar6 == 0) break;
      ptVar16 = ptVar15 + -1;
      lVar14 = (long)ptVar16 - (long)in_stack_fffffffffffffea0;
      local_140 = ptVar19;
      if ((in_stack_fffffffffffffea8 != lVar14 + 1) &&
         (__n = in_stack_fffffffffffffea8 - (lVar14 + 1), __n != 0)) {
        ptVar15 = ptVar19 + lVar14;
        if (__n == 1) {
          *ptVar15 = ptVar15[1];
        }
        else {
          memmove(ptVar15,ptVar19 + lVar14 + 1,__n);
          local_140 = ptVar19;
        }
      }
      local_138 = in_stack_fffffffffffffea8 + -1;
      local_140[in_stack_fffffffffffffea8 + -1] = (type_info)0x0;
      ptVar15 = local_140 + lVar14;
      bVar17 = ptVar16 != in_stack_fffffffffffffea0;
      in_stack_fffffffffffffea0 = local_140;
      in_stack_fffffffffffffea8 = local_138;
    } while (bVar17);
  }
  ptVar15 = &local_150;
  if (local_140 == ptVar15) {
    uStack_128 = uStack_148;
    local_140 = (type_info *)&local_130;
  }
  ptVar19 = local_140;
  local_130 = CONCAT71(uStack_14f,local_150);
  pTVar20 = (TestFactoryBase *)0x0;
  local_150 = (type_info)0x0;
  GetTypeName_abi_cxx11_(&local_70,(internal *)&char32_t::typeinfo,(type_info *)&local_130);
  _Var5._M_p = local_70._M_dataplus._M_p;
  pcVar3 = (code_location->file)._M_dataplus._M_p;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar3,pcVar3 + (code_location->file)._M_string_length);
  local_78 = code_location->line;
  p_Var8 = SuiteApiResolver<WordSplitStringTest_single_word_Test<char32_t>_>::GetSetUpCaseOrSuite
                     ((code_location->file)._M_dataplus._M_p,local_78);
  p_Var9 = SuiteApiResolver<WordSplitStringTest_single_word_Test<char32_t>_>::GetTearDownCaseOrSuite
                     ((code_location->file)._M_dataplus._M_p,code_location->line);
  uVar18 = 0x42bcb8;
  puVar10 = (undefined8 *)operator_new(8);
  *puVar10 = &PTR__TestFactoryBase_00576108;
  CVar4.file._M_string_length = (size_type)p_Var9;
  CVar4.file._M_dataplus._M_p = (pointer)p_Var8;
  CVar4.file.field_2._M_allocated_capacity = (size_type)puVar10;
  CVar4.file.field_2._8_8_ = uVar18;
  CVar4._32_8_ = in_stack_fffffffffffffe98;
  testing::internal::MakeAndRegisterTestInfo
            ((char *)psVar2,(char *)ptVar19,_Var5._M_p,(char *)0x0,CVar4,local_98,
             (_func_void *)&TypeIdHelper<WordSplitStringTest<char32_t>>::dummy_,
             (_func_void *)ptVar15,pTVar20);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != (type_info *)&local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (ptVar15 != &local_150) {
    operator_delete(ptVar15,CONCAT71(uStack_14f,local_150) + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }